

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<ParticleTest,_testing::internal::TemplateSel<ParticleTest_GetGamma_Test>,_testing::internal::Types1<pica::Particle<(pica::Dimension)3>_>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  char *type_param;
  char *pcVar1;
  TestFactoryBase *factory;
  char *pcVar2;
  size_t __n;
  String local_50;
  char *local_40;
  char *local_30 [2];
  
  pcVar2 = "/";
  if (*prefix == '\0') {
    pcVar2 = "";
  }
  String::Format((char *)local_30,"%s%s%s/%d",prefix,pcVar2,case_name,(ulong)(uint)index);
  pcVar2 = local_30[0];
  pcVar1 = strchr(test_names,0x2c);
  if (pcVar1 == (char *)0x0) {
    String::String(&local_50,test_names);
  }
  else {
    __n = (long)pcVar1 - (long)test_names;
    pcVar1 = (char *)operator_new__(__n + 1);
    memcpy(pcVar1,test_names,__n);
    pcVar1[__n] = '\0';
    local_50.c_str_ = pcVar1;
    local_50.length_ = __n;
  }
  pcVar1 = local_50.c_str_;
  GetTypeName<pica::Particle<(pica::Dimension)3>>();
  type_param = local_40;
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001f7f70;
  MakeAndRegisterTestInfo
            (pcVar2,pcVar1,type_param,(char *)0x0,
             &TypeIdHelper<ParticleTest<pica::Particle<(pica::Dimension)3>>>::dummy_,
             Test::SetUpTestCase,Test::TearDownTestCase,factory);
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  if (local_50.c_str_ != (char *)0x0) {
    operator_delete__(local_50.c_str_);
  }
  if (local_30[0] != (char *)0x0) {
    operator_delete__(local_30[0]);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        String::Format("%s%s%s/%d", prefix, prefix[0] == '\0' ? "" : "/",
                       case_name, index).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }